

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::FillRuleCase::iterate(FillRuleCase *this)

{
  int *value;
  float *pfVar1;
  ostringstream *poVar2;
  FillRuleCaseType FVar3;
  uint uVar4;
  TestLog *pTVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  RenderTarget *pRVar9;
  long lVar10;
  undefined4 extraout_var;
  long lVar11;
  ulong uVar12;
  Surface *pSVar13;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *description;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int row;
  ulong uVar19;
  IterateResult IVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined8 uVar32;
  float fVar33;
  allocator<char> local_369;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Vector<float,_2> local_330;
  Vector<float,_2> local_328;
  Vec2 center;
  Vec2 sideH;
  Surface resultImage;
  Vector<float,_2> local_2c0;
  Vec2 sideV;
  Random rnd;
  string local_220;
  ScopedLogSection section;
  Vec2 quad [4];
  string iterationDescription;
  
  sideV.m_data[0] = (float)(this->m_iteration + 1);
  de::toString<int>((string *)&center,(int *)&sideV);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                 "Test iteration ",(string *)&center);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)quad,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd," / ");
  value = &this->m_iterationCount;
  de::toString<int>((string *)&sideH,value);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)quad,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sideH);
  std::__cxx11::string::~string((string *)&sideH);
  std::__cxx11::string::~string((string *)quad);
  std::__cxx11::string::~string((string *)&rnd);
  std::__cxx11::string::~string((string *)&center);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_log,&iterationDescription,&iterationDescription);
  pRVar9 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar23 = 1 << (8U - (char)(pRVar9->m_pixelFormat).redBits & 0x1f);
  pRVar9 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar7 = 1 << (8U - (char)(pRVar9->m_pixelFormat).greenBits & 0x1f);
  pRVar9 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar15 = 1 << (8U - (char)(pRVar9->m_pixelFormat).blueBits & 0x1f);
  iVar8 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar8,iVar8);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  FVar3 = this->m_caseType;
  if (FVar3 < FILLRULECASE_LAST) {
    iVar8 = this->m_iteration;
    if ((0x13U >> (FVar3 & 0x1f) & 1) == 0) {
      rnd.m_rnd.x = 0x3f000000;
      fVar27 = *(float *)(&DAT_0181a860 + (ulong)(FVar3 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      if (FVar3 != FILLRULECASE_CLIPPED_PARTIAL) {
        rnd.m_rnd.x = 0;
      }
      fVar28 = ((float)iVar8 / (float)(*value + -1)) * 3.1415927 * 0.5;
      rnd.m_rnd.y = rnd.m_rnd.x;
      fVar29 = cosf(fVar28);
      quad[0].m_data[1] = sinf(fVar28);
      quad[0].m_data[0] = fVar29;
      tcu::operator*(fVar27,quad);
      sideH.m_data[1] = -center.m_data[0];
      sideH.m_data[0] = center.m_data[1];
      tcu::operator+((Vector<float,_2> *)&rnd,&center);
      tcu::operator+(&sideV,&sideH);
      tcu::operator+((Vector<float,_2> *)&rnd,&center);
      tcu::operator-((Vector<float,_2> *)&local_220,&sideH);
      tcu::operator-((Vector<float,_2> *)&rnd,&center);
      tcu::operator-(&local_328,&sideH);
      tcu::operator-((Vector<float,_2> *)&rnd,&center);
      tcu::operator+(&local_330,&sideH);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&drawBuffer,6);
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[0] = quad[0].m_data[0];
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[1] = quad[0].m_data[1];
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = quad[1].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = quad[1].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = quad[2].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = quad[2].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = quad[2].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = quad[2].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = quad[0].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = quad[0].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = quad[3].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = quad[3].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init(&rnd.m_rnd,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&drawBuffer,0x60);
      iVar8 = iVar8 << 4;
      lVar14 = 0;
      lVar22 = 0;
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        fVar27 = ((float)(int)lVar11 + 0.5) * 0.25;
        uVar19 = 0;
        lVar21 = lVar22;
        for (lVar24 = 0; lVar24 != 0x180; lVar24 = lVar24 + 0x60) {
          fVar28 = ((float)(int)uVar19 + 0.5) * 0.25;
          center.m_data[0] = fVar28 + fVar28 + -1.0;
          fVar28 = ((float)(iVar8 + (int)uVar19) / (float)(*value << 4)) * 3.1415927 * 0.5;
          center.m_data[1] = fVar27 + fVar27 + -1.0;
          fVar29 = cosf(fVar28);
          quad[0].m_data[1] = sinf(fVar28);
          quad[0].m_data[0] = fVar29;
          tcu::operator*(0.15,quad);
          sideV.m_data[1] = -sideH.m_data[0];
          sideV.m_data[0] = sideH.m_data[1];
          tcu::operator+(&center,&sideH);
          tcu::operator+((Vector<float,_2> *)&local_220,&sideV);
          tcu::operator+(&center,&sideH);
          tcu::operator-(&local_328,&sideV);
          tcu::operator-(&center,&sideH);
          tcu::operator-(&local_330,&sideV);
          tcu::operator-(&center,&sideH);
          tcu::operator+(&local_2c0,&sideV);
          FVar3 = this->m_caseType;
          if (FVar3 == FILLRULECASE_PROJECTED) {
            fVar28 = deRandom_getFloat(&rnd.m_rnd);
            fVar28 = fVar28 * 3.9 + 0.1;
            fVar29 = deRandom_getFloat(&rnd.m_rnd);
            fVar29 = fVar29 * 3.9 + 0.1;
            fVar30 = deRandom_getFloat(&rnd.m_rnd);
            fVar31 = deRandom_getFloat(&rnd.m_rnd);
            fVar33 = fVar30 * 3.9 + 0.1;
            fVar30 = fVar31 * 3.9 + 0.1;
            *(ulong *)((long)(drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar24 + lVar14)
                 = CONCAT44(quad[0].m_data[1] * fVar28,quad[0].m_data[0] * fVar28);
            *(undefined4 *)
             ((long)(drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar24 + 8 + lVar14) = 0;
            *(float *)((long)(drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar24 + 0xc + lVar14) = fVar28;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar14 + lVar24)
                 = CONCAT44(fVar29 * quad[1].m_data[1],fVar29 * quad[1].m_data[0]);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar24 + lVar14 + 8) = 0;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar24 + lVar14 + 0xc) = fVar29;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar14 + lVar24)
                 = CONCAT44(quad[2].m_data[1] * fVar33,quad[2].m_data[0] * fVar33);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar24 + lVar14 + 8) = 0;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar24 + lVar14 + 0xc) = fVar33;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar14 + lVar24)
                 = CONCAT44(quad[2].m_data[1] * fVar33,quad[2].m_data[0] * fVar33);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar24 + lVar14 + 8) = 0;
            lVar10 = (uVar19 | lVar11 * 4) * 6;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar24 + lVar14 + 0xc) = fVar33;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar14 + lVar24)
                 = CONCAT44(quad[0].m_data[1] * fVar28,quad[0].m_data[0] * fVar28);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar24 + lVar14 + 8) = 0;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar24 + lVar14 + 0xc) = fVar28;
            uVar32 = CONCAT44(fVar30 * quad[3].m_data[1],fVar30 * quad[3].m_data[0]);
LAB_00ebe3dc:
            *(undefined8 *)
             drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar10 + 5].m_data = uVar32;
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10 + 5].m_data[2] = 0.0;
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10 + 5].m_data[3] = fVar30;
          }
          else {
            if (FVar3 == FILLRULECASE_REVERSED) {
              lVar10 = (uVar19 | lVar11 * 4) * 6;
              pfVar1 = (float *)((long)(drawBuffer.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar24 + lVar14);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[1].m_data[0];
              pfVar1[1] = quad[1].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
LAB_00ebe233:
              uVar32 = CONCAT44(quad[3].m_data[1],quad[3].m_data[0]);
              fVar30 = 1.0;
              goto LAB_00ebe3dc;
            }
            if (FVar3 == FILLRULECASE_BASIC) {
              pfVar1 = (float *)((long)(drawBuffer.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar24 + lVar14);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[1].m_data[0];
              pfVar1[1] = quad[1].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                                lVar14 + lVar24);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              lVar10 = lVar21;
              goto LAB_00ebe233;
            }
          }
          uVar19 = uVar19 + 1;
          lVar21 = lVar21 + 6;
        }
        lVar22 = lVar22 + 0x18;
        lVar14 = lVar14 + 0x180;
        iVar8 = iVar8 + 4;
      }
    }
  }
  iVar8 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar8);
  quad[0].m_data = (float  [2])&DAT_3f0000003f000000;
  quad[1].m_data[0] = 0.5;
  quad[1].m_data[1] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd,
             (long)drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)quad,
             (allocator_type *)&center);
  quad[0].m_data =
       (float  [2])
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar2 = (ostringstream *)(quad + 1);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,
                  "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  (**(code **)(lVar11 + 0x5e0))(0xbe2);
  (**(code **)(lVar11 + 0x100))(0x8006);
  IVar20 = CONTINUE;
  (**(code **)(lVar11 + 0x120))(1,1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd,4);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd);
  quad[0].m_data =
       (float  [2])
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar2 = (ostringstream *)(quad + 1);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Verifying result.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  uVar19 = 0;
  uVar17 = 0;
  if (0 < resultImage.m_width) {
    uVar17 = (ulong)(uint)resultImage.m_width;
  }
  uVar12 = (ulong)(uint)resultImage.m_height;
  if (resultImage.m_height < 1) {
    uVar12 = uVar19;
  }
  bVar6 = false;
  for (iVar8 = 0; iVar8 != (int)uVar12; iVar8 = iVar8 + 1) {
    iVar16 = (int)uVar19;
    uVar18 = uVar17;
    while (bVar25 = uVar18 != 0, uVar18 = uVar18 - 1, bVar25) {
      uVar4 = *(uint *)((long)resultImage.m_pixels.m_ptr + (long)(int)uVar19 * 4);
      if (((iVar23 < (int)((uVar4 & 0xff) - 0x7f)) || (iVar7 < (int)((uVar4 >> 8 & 0xff) - 0x7f)))
         || (iVar15 < (int)((uVar4 >> 0x10 & 0xff) - 0x7f))) {
        bVar6 = true;
      }
      uVar19 = (ulong)((int)uVar19 + 1);
    }
    uVar19 = (ulong)(uint)(iVar16 + resultImage.m_width);
  }
  if (bVar6) {
    quad[0].m_data =
         (float  [2])
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar2 = (ostringstream *)(quad + 1);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Overlapping fragments detected, image is not valid.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    pTVar5 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&center,"Result of rendering",(allocator<char> *)&local_328);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sideH,"Result of rendering",(allocator<char> *)&local_330);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&rnd,(string *)&center,(string *)&sideH);
    iVar8 = (int)pTVar5;
    tcu::LogImageSet::write((LogImageSet *)&rnd,iVar8,__buf,uVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sideV,"Result",(allocator<char> *)&local_2c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Result",&local_369);
    pSVar13 = &resultImage;
    tcu::LogImage::LogImage
              ((LogImage *)quad,(string *)&sideV,&local_220,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)quad,iVar8,__buf_00,(size_t)pSVar13);
    tcu::TestLog::endImageSet(pTVar5);
    tcu::LogImage::~LogImage((LogImage *)quad);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&sideV);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&rnd);
    std::__cxx11::string::~string((string *)&sideH);
    std::__cxx11::string::~string((string *)&center);
    this->m_allIterationsPassed = false;
  }
  else {
    quad[0].m_data =
         (float  [2])
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar2 = (ostringstream *)(quad + 1);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"No overlapping fragments detected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  if (this->m_caseType == FILLRULECASE_CLIPPED_FULL) {
    quad[0].m_data =
         (float  [2])
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar2 = (ostringstream *)(quad + 1);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Searching missing fragments.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    uVar19 = 0;
    uVar17 = 0;
    if (0 < resultImage.m_width) {
      uVar17 = (ulong)(uint)resultImage.m_width;
    }
    uVar12 = (ulong)(uint)resultImage.m_height;
    if (resultImage.m_height < 1) {
      uVar12 = uVar19;
    }
    bVar25 = false;
    for (iVar8 = 0; iVar8 != (int)uVar12; iVar8 = iVar8 + 1) {
      iVar16 = (int)uVar19;
      uVar18 = uVar17;
      while (bVar26 = uVar18 != 0, uVar18 = uVar18 - 1, bVar26) {
        uVar4 = *(uint *)((long)resultImage.m_pixels.m_ptr + (long)(int)uVar19 * 4);
        if ((((int)(uVar4 & 0xff) <= iVar23) || ((int)(uVar4 >> 8 & 0xff) <= iVar7)) ||
           ((int)(uVar4 >> 0x10 & 0xff) <= iVar15)) {
          bVar25 = true;
        }
        uVar19 = (ulong)((int)uVar19 + 1);
      }
      uVar19 = (ulong)(uint)(iVar16 + resultImage.m_width);
    }
    if (bVar25) {
      quad[0].m_data =
           (float  [2])
           ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      poVar2 = (ostringstream *)(quad + 1);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Missing fragments detected, image is not valid.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      if (!bVar6) {
        pTVar5 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&center,"Result of rendering",(allocator<char> *)&local_328);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sideH,"Result of rendering",(allocator<char> *)&local_330);
        tcu::LogImageSet::LogImageSet((LogImageSet *)&rnd,(string *)&center,(string *)&sideH);
        iVar8 = (int)pTVar5;
        tcu::LogImageSet::write((LogImageSet *)&rnd,iVar8,__buf_01,uVar12);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sideV,"Result",(allocator<char> *)&local_2c0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Result",&local_369)
        ;
        pSVar13 = &resultImage;
        tcu::LogImage::LogImage
                  ((LogImage *)quad,(string *)&sideV,&local_220,pSVar13,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)quad,iVar8,__buf_02,(size_t)pSVar13);
        tcu::TestLog::endImageSet(pTVar5);
        tcu::LogImage::~LogImage((LogImage *)quad);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&sideV);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&rnd);
        std::__cxx11::string::~string((string *)&sideH);
        std::__cxx11::string::~string((string *)&center);
      }
      this->m_allIterationsPassed = false;
    }
    else {
      quad[0].m_data =
           (float  [2])
           ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      poVar2 = (ostringstream *)(quad + 1);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"No missing fragments detected.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
    }
  }
  iVar8 = this->m_iteration + 1;
  this->m_iteration = iVar8;
  if (iVar8 == this->m_iterationCount) {
    description = "Found invalid pixels";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar20 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return IVar20;
}

Assistant:

FillRuleCase::IterateResult FillRuleCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const int								thresholdRed			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().redBits);
	const int								thresholdGreen			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().greenBits);
	const int								thresholdBlue			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().blueBits);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	bool									imageShown				= false;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		gl.enable(GL_BLEND);
		gl.blendEquation(GL_FUNC_ADD);
		gl.blendFunc(GL_ONE, GL_ONE);
		drawPrimitives(resultImage, drawBuffer, colorBuffer, GL_TRIANGLES);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_testCtx.getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
								<< tcu::TestLog::Image("Result", "Result", resultImage)
								<< tcu::TestLog::EndImageSet;

			imageShown = true;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_testCtx.getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			if (!imageShown)
			{
				m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
									<< tcu::TestLog::Image("Result", "Result", resultImage)
									<< tcu::TestLog::EndImageSet;
			}

			m_allIterationsPassed = false;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixels");

		return STOP;
	}
	else
		return CONTINUE;
}